

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noisy_laser_tag.cpp
# Opt level: O0

void __thiscall despot::NoisyLaserTag::Init(NoisyLaserTag *this)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  reference ppTVar4;
  double *pdVar5;
  reference this_00;
  double dVar6;
  double local_78;
  double local_50;
  double prob;
  double local_40;
  double max_noise;
  double min_noise;
  double dStack_28;
  int reading;
  double dist;
  int local_18;
  int d;
  int s;
  int i;
  NoisyLaserTag *this_local;
  
  _s = this;
  for (d = 0; d < NBEAMS; d = d + 1) {
    SetReading(&(this->super_BaseTag).same_loc_obs_,0x65,(long)d);
  }
  iVar1 = (**(code **)(*(long *)&this->super_BaseTag + 0x10))();
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::resize(&this->reading_distributions_,(long)iVar1);
  local_18 = 0;
  while( true ) {
    iVar1 = local_18;
    iVar2 = (**(code **)(*(long *)&this->super_BaseTag + 0x10))();
    if (iVar2 <= iVar1) break;
    pvVar3 = std::
             vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             ::operator[](&this->reading_distributions_,(long)local_18);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(pvVar3,(long)NBEAMS);
    for (dist._4_4_ = 0; dist._4_4_ < NBEAMS; dist._4_4_ = dist._4_4_ + 1) {
      ppTVar4 = std::vector<despot::TagState_*,_std::allocator<despot::TagState_*>_>::operator[]
                          (&(this->super_BaseTag).states_,(long)local_18);
      dStack_28 = LaserRange(this,&(*ppTVar4)->super_State,dist._4_4_);
      for (min_noise._4_4_ = 0; (double)min_noise._4_4_ < dStack_28 / this->unit_size_;
          min_noise._4_4_ = min_noise._4_4_ + 1) {
        max_noise = (double)min_noise._4_4_ * this->unit_size_ + -dStack_28;
        prob = (double)(min_noise._4_4_ + 1) * this->unit_size_;
        pdVar5 = std::min<double>(&stack0xffffffffffffffd8,&prob);
        local_40 = *pdVar5 - dStack_28;
        dVar6 = (double)despot::gausscdf(local_40,0.0,this->noise_sigma_);
        if (min_noise._4_4_ < 1) {
          local_78 = 0.0;
        }
        else {
          local_78 = (double)despot::gausscdf(max_noise,0.0,this->noise_sigma_);
        }
        local_50 = (dVar6 - local_78) * 2.0;
        pvVar3 = std::
                 vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ::operator[](&this->reading_distributions_,(long)local_18);
        this_00 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](pvVar3,(long)dist._4_4_);
        std::vector<double,_std::allocator<double>_>::push_back(this_00,&local_50);
      }
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void NoisyLaserTag::Init() {
	for (int i = 0; i < NBEAMS; i++)
		SetReading(same_loc_obs_, 101, i);

	reading_distributions_.resize(NumStates());

	for (int s = 0; s < NumStates(); s++) {
		reading_distributions_[s].resize(NBEAMS);

		for (int d = 0; d < NBEAMS; d++) {
			double dist = LaserRange(*states_[s], d);
			for (int reading = 0; reading < dist / unit_size_; reading++) {
				double min_noise = reading * unit_size_ - dist;
				double max_noise = min(dist, (reading + 1) * unit_size_) - dist;
				double prob =
					2
						* (gausscdf(max_noise, 0, noise_sigma_)
							- (reading > 0 ?
								gausscdf(min_noise, 0, noise_sigma_) : 0 /*min_noise = -infty*/));

				reading_distributions_[s][d].push_back(prob);
			}
		}
	}
}